

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall rw::Image::palettize(Image *this,int32 depth)

{
  uint32 dstStride;
  uint8 *dstPixels;
  undefined4 in_register_00000034;
  uint8 *__ptr;
  int local_44c;
  uint32 newstride;
  uint8 *newpixels;
  ColorQuant quant;
  RGBA colors [256];
  int32 depth_local;
  Image *this_local;
  
  ColorQuant::init((ColorQuant *)&newpixels,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,depth));
  ColorQuant::addImage((ColorQuant *)&newpixels,this);
  ColorQuant::makePalette
            ((ColorQuant *)&newpixels,1 << ((byte)depth & 0x1f),(RGBA *)&quant.leaves.link.prev);
  dstStride = this->width;
  dstPixels = (uint8 *)mustmalloc_LOC((ulong)(dstStride * this->height),0x30018,
                                      "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/image.cpp line: 687"
                                     );
  __ptr = dstPixels;
  ColorQuant::matchImage((ColorQuant *)&newpixels,dstPixels,dstStride,this);
  free(this,__ptr);
  this->depth = depth;
  if (depth < 8) {
    local_44c = 1;
  }
  else {
    local_44c = depth / 8;
  }
  this->bpp = local_44c;
  this->stride = dstStride;
  this->pixels = (uint8 *)0x0;
  this->palette = (uint8 *)0x0;
  setPixels(this,dstPixels);
  allocate(this);
  memcpy(this->palette,&quant.leaves.link.prev,(long)((1 << ((byte)depth & 0x1f)) << 2));
  ColorQuant::destroy((ColorQuant *)&newpixels);
  return;
}

Assistant:

void
Image::palettize(int32 depth)
{
	RGBA colors[256];
	ColorQuant quant;
	uint8 *newpixels;
	uint32 newstride;

	quant.init();
	quant.addImage(this);
	assert(depth <= 8);
	quant.makePalette(1<<depth, colors);

	newstride = this->width;
	newpixels = rwNewT(uint8, newstride*this->height, MEMDUR_EVENT | ID_IMAGE);
	// TODO: maybe do floyd-steinberg dithering?
	quant.matchImage(newpixels, newstride, this);

	this->free();
	this->depth = depth;
	this->bpp = depth < 8 ? 1 : depth/8;
	this->stride = newstride;
	this->pixels = nil;
	this->palette = nil;
	this->setPixels(newpixels);
	this->allocate();
	memcpy(this->palette, colors, 4*(1<<depth));

	quant.destroy();
}